

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype)

{
  LogMessage *other;
  LogFinisher local_69;
  undefined1 local_68 [14];
  bool local_5a;
  anon_union_16_2_0e0aa8cc_for_ExtensionInfo_5 local_58;
  FieldDescriptor *pFStack_48;
  
  if ((type & 0xfe) != 10) {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xc1);
    other = LogMessage::operator<<
                      ((LogMessage *)local_68,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage((LogMessage *)local_68);
  }
  local_58.enum_validity_check.arg = (pointer)0x0;
  pFStack_48 = (FieldDescriptor *)0x0;
  local_68._0_8_ = extendee;
  local_68._8_4_ = number;
  local_68[0xc] = type;
  local_68[0xd] = is_repeated;
  local_5a = is_packed;
  local_58.enum_validity_check.func = (EnumValidityFuncWithArg *)prototype;
  anon_unknown_26::Register((ExtensionInfo *)local_68);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(info);
}